

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O3

void __thiscall
cbtAlignedObjectArray<cbtHashString>::reserve(cbtAlignedObjectArray<cbtHashString> *this,int _Count)

{
  char *pcVar1;
  undefined4 *puVar2;
  long *plVar3;
  int iVar4;
  cbtHashString *pcVar5;
  long lVar6;
  cbtHashString *pcVar7;
  long lVar8;
  
  if (this->m_capacity < _Count) {
    if (_Count == 0) {
      pcVar7 = (cbtHashString *)0x0;
    }
    else {
      pcVar7 = (cbtHashString *)cbtAlignedAllocInternal((long)_Count * 0x28,0x10);
    }
    iVar4 = this->m_size;
    if (0 < (long)iVar4) {
      lVar8 = 0;
      do {
        pcVar5 = this->m_data;
        pcVar1 = (pcVar7->m_string1).field_2._M_local_buf + lVar8;
        *(char **)(pcVar1 + -0x10) = pcVar1;
        lVar6 = *(long *)((long)&(pcVar5->m_string1)._M_dataplus._M_p + lVar8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&(pcVar7->m_string1)._M_dataplus._M_p + lVar8),lVar6,
                   *(long *)((long)&(pcVar5->m_string1)._M_string_length + lVar8) + lVar6);
        puVar2 = (undefined4 *)((long)&pcVar5->m_hash + lVar8);
        lVar8 = lVar8 + 0x28;
        *(undefined4 *)(pcVar1 + 0x10) = *puVar2;
      } while ((long)iVar4 * 0x28 != lVar8);
      iVar4 = this->m_size;
      if (0 < (long)iVar4) {
        lVar8 = 0;
        do {
          plVar3 = (long *)((this->m_data->m_string1).field_2._M_local_buf + lVar8);
          if (plVar3 != (long *)plVar3[-2]) {
            operator_delete((long *)plVar3[-2],*plVar3 + 1);
          }
          lVar8 = lVar8 + 0x28;
        } while ((long)iVar4 * 0x28 != lVar8);
      }
    }
    if ((this->m_data != (cbtHashString *)0x0) && (this->m_ownsMemory == true)) {
      cbtAlignedFreeInternal(this->m_data);
    }
    this->m_ownsMemory = true;
    this->m_data = pcVar7;
    this->m_capacity = _Count;
  }
  return;
}

Assistant:

SIMD_FORCE_INLINE void reserve(int _Count)
	{  // determine new minimum length of allocated storage
		if (capacity() < _Count)
		{  // not enough room, reallocate
			T* s = (T*)allocate(_Count);

			copy(0, size(), s);

			destroy(0, size());

			deallocate();

			//PCK: added this line
			m_ownsMemory = true;

			m_data = s;

			m_capacity = _Count;
		}
	}